

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O2

void save_load_header(vw *all,io_buf *model_file,bool read,bool text,string *file_options,
                     options_i *options)

{
  string *__rhs;
  pointer pbVar1;
  undefined2 *puVar2;
  element_type *peVar3;
  uint uVar4;
  size_type sVar5;
  char *__dest;
  pointer psVar6;
  bool bVar7;
  int iVar8;
  uint32_t uVar9;
  ostream *poVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  difference_type dVar16;
  uint64_t uVar17;
  vw_exception *pvVar18;
  ulong uVar19;
  size_t i;
  ulong uVar20;
  uint uVar21;
  size_t i_2;
  long lVar22;
  size_t i_1;
  vw *pvVar23;
  shared_ptr<VW::config::base_option> *option;
  pointer psVar24;
  long lVar25;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar26;
  uint32_t ngram_len;
  char *buff2;
  vw *local_430;
  string *local_428;
  uint32_t pair_len;
  undefined4 uStack_41c;
  pointer local_418;
  version_struct *local_400;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_3f8;
  uint32_t local_num_bits;
  char model;
  uint32_t triple_len;
  options_i *local_3c8;
  uint32_t skip_len;
  size_t buf2_size;
  char triple [4];
  size_t local_390;
  stringstream temp;
  int local_380;
  ostream local_378;
  stringstream msg;
  ostream local_1e8;
  string local_70;
  string local_50;
  
  local_428 = file_options;
  local_3c8 = options;
  buff2 = (char *)malloc(0x200);
  buf2_size = 0x200;
  if ((model_file->files)._end != (model_file->files)._begin) {
    version_struct::to_string_abi_cxx11_((string *)&temp,&version);
    local_430 = all;
    std::__cxx11::string::~string((string *)&temp);
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar10 = std::operator<<(&local_1e8,"Version ");
    version_struct::to_string_abi_cxx11_((string *)&temp,&version);
    poVar10 = std::operator<<(poVar10,(string *)&temp);
    std::operator<<(poVar10,"\n");
    std::__cxx11::string::~string((string *)&temp);
    __dest = buff2;
    version_struct::to_string_abi_cxx11_((string *)&temp,&version);
    sVar13 = (size_t)(local_380 + 1);
    sVar12 = buf2_size;
    if (sVar13 < buf2_size) {
      sVar12 = sVar13;
    }
    memcpy(__dest,_temp,sVar12);
    std::__cxx11::string::~string((string *)&temp);
    if (read) {
      sVar13 = buf2_size & 0xffffffff;
      uVar20 = 0x200;
      if (sVar13 < 0x200) {
        uVar20 = sVar13;
      }
      buff2[uVar20 - 1] = '\0';
    }
    pvVar11 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)bin_text_read_write(model_file,buff2,sVar13,"",read,&msg,text);
    pvVar23 = local_430;
    local_400 = &local_430->model_file_ver;
    version_struct::from_string(local_400,buff2);
    VW::validate_version(pvVar23);
    bVar7 = version_struct::operator>=(local_400,"8.0.2");
    if (bVar7) {
      model_file->_verify_hash = true;
    }
    bVar7 = version_struct::operator>=(local_400,"8.0.3");
    pvVar23 = local_430;
    local_3f8 = pvVar11;
    if (bVar7) {
      sVar5 = (local_430->id)._M_string_length;
      poVar10 = std::operator<<(&local_1e8,"Id ");
      __rhs = &local_430->id;
      poVar10 = std::operator<<(poVar10,(string *)__rhs);
      std::operator<<(poVar10,"\n");
      uVar21 = (int)sVar5 + 1;
      uVar4 = 0x200;
      if (uVar21 < 0x200) {
        uVar4 = uVar21;
      }
      memcpy(buff2,(__rhs->_M_dataplus)._M_p,(ulong)uVar4);
      sVar12 = 0x200;
      if (!read) {
        sVar12 = (ulong)uVar21;
      }
      sVar12 = bin_text_read_write(model_file,buff2,sVar12,"",read,&msg,text);
      std::__cxx11::string::assign((char *)__rhs);
      local_3f8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&(pvVar11->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + sVar12);
      pvVar23 = local_430;
      if (read) {
        std::__cxx11::string::string((string *)&temp,"id",(allocator *)&pair_len);
        pvVar23 = local_430;
        iVar8 = (*local_3c8->_vptr_options_i[1])(local_3c8,&temp);
        sVar5 = (pvVar23->id)._M_string_length;
        std::__cxx11::string::~string((string *)&temp);
        if ((char)iVar8 == '\0' && sVar5 != 0) {
          std::__cxx11::string::append((char *)local_428);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp,
                         " ",__rhs);
          std::__cxx11::string::append((string *)local_428);
          pvVar23 = local_430;
          std::__cxx11::string::~string((string *)&temp);
        }
      }
    }
    model = 'm';
    local_390 = 1;
    sVar12 = bin_text_read_write_fixed_validated
                       (model_file,&model,1,"file is not a model file",read,&msg,text);
    poVar10 = std::operator<<(&local_1e8,"Min label:");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar23->sd->min_label);
    std::operator<<(poVar10,"\n");
    sVar13 = bin_text_read_write_fixed_validated
                       (model_file,(char *)&pvVar23->sd->min_label,4,"",read,&msg,text);
    poVar10 = std::operator<<(&local_1e8,"Max label:");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,pvVar23->sd->max_label);
    std::operator<<(poVar10,"\n");
    sVar14 = bin_text_read_write_fixed_validated
                       (model_file,(char *)&pvVar23->sd->max_label,4,"",read,&msg,text);
    poVar10 = std::operator<<(&local_1e8,"bits:");
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::operator<<(poVar10,"\n");
    local_num_bits = pvVar23->num_bits;
    sVar15 = bin_text_read_write_fixed_validated
                       (model_file,(char *)&local_num_bits,4,"",read,&msg,text);
    if (read) {
      std::__cxx11::string::string((string *)&temp,"bit_precision",(allocator *)&pair_len);
      iVar8 = (*local_3c8->_vptr_options_i[1])(local_3c8,&temp);
      std::__cxx11::string::~string((string *)&temp);
      pvVar23 = local_430;
      if ((char)iVar8 == '\0') {
        std::__cxx11::string::append((char *)local_428);
        std::__cxx11::stringstream::stringstream((stringstream *)&temp);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_378);
        std::__cxx11::stringbuf::str();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pair_len," ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &triple_len);
        std::__cxx11::string::append((string *)local_428);
        std::__cxx11::string::~string((string *)&pair_len);
        std::__cxx11::string::~string((string *)&triple_len);
        std::__cxx11::stringstream::~stringstream((stringstream *)&temp);
      }
    }
    VW::validate_default_bits(pvVar23,local_num_bits);
    pvVar23->default_bits = false;
    pvVar23->num_bits = local_num_bits;
    VW::validate_num_bits(pvVar23);
    bVar7 = version_struct::operator<(local_400,"7.10.3");
    lVar25 = (long)&(local_3f8->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + sVar15 + sVar14 + sVar13 + sVar12;
    if (bVar7) {
      pair_len = (uint32_t)
                 ((ulong)((long)(pvVar23->pairs).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar23->pairs).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1e8);
      std::operator<<(poVar10," pairs: ");
      sVar12 = bin_text_read_write_fixed_validated(model_file,(char *)&pair_len,4,"",read,&msg,text)
      ;
      local_3f8 = &pvVar23->pairs;
      lVar25 = sVar12 + lVar25;
      lVar22 = 0;
      for (uVar20 = 0; uVar20 < pair_len; uVar20 = uVar20 + 1) {
        triple_len = triple_len & 0xff000000;
        if (!read) {
          pbVar1 = (local_3f8->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          triple_len = CONCAT22(triple_len._2_2_,
                                **(undefined2 **)((long)&(pbVar1->_M_dataplus)._M_p + lVar22));
          poVar10 = std::operator<<(&local_1e8,
                                    (string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar22));
          std::operator<<(poVar10," ");
        }
        sVar12 = bin_text_read_write_fixed_validated
                           (model_file,(char *)&triple_len,2,"",read,&msg,text);
        if (read) {
          std::__cxx11::string::string((string *)&temp,(char *)&triple_len,(allocator *)triple);
          dVar16 = std::
                   __count_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             ((local_430->pairs).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (local_430->pairs).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &temp);
          if (dVar16 == 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_3f8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp);
          }
          std::__cxx11::string::~string((string *)&temp);
        }
        lVar25 = lVar25 + sVar12;
        lVar22 = lVar22 + 0x20;
      }
      std::operator<<(&local_1e8,"\n");
      pvVar23 = local_430;
      sVar12 = bin_text_read_write_fixed_validated(model_file,(char *)0x0,0,"",read,&msg,text);
      triple_len = (uint32_t)
                   ((ulong)((long)(pvVar23->triples).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar23->triples).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1e8);
      std::operator<<(poVar10," triples: ");
      sVar13 = bin_text_read_write_fixed_validated
                         (model_file,(char *)&triple_len,4,"",read,&msg,text);
      pvVar11 = &pvVar23->triples;
      lVar25 = sVar12 + lVar25 + sVar13;
      lVar22 = 0;
      for (uVar20 = 0; uVar20 < triple_len; uVar20 = uVar20 + 1) {
        triple[0] = '\0';
        triple[1] = '\0';
        triple[2] = '\0';
        triple[3] = '\0';
        if (!read) {
          poVar10 = std::operator<<(&local_1e8,
                                    (string *)
                                    ((long)&(((pvVar11->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar22));
          std::operator<<(poVar10," ");
          puVar2 = *(undefined2 **)
                    ((long)&(((pvVar11->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                    lVar22);
          triple[2] = *(undefined1 *)(puVar2 + 1);
          triple._0_2_ = *puVar2;
        }
        sVar12 = bin_text_read_write_fixed_validated(model_file,triple,3,"",read,&msg,text);
        if (read) {
          std::__cxx11::string::string((string *)&temp,triple,(allocator *)&ngram_len);
          dVar16 = std::
                   __count_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             ((local_430->triples).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (local_430->triples).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &temp);
          if (dVar16 == 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pvVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&temp);
          }
          std::__cxx11::string::~string((string *)&temp);
        }
        lVar25 = lVar25 + sVar12;
        lVar22 = lVar22 + 0x20;
      }
      std::operator<<(&local_1e8,"\n");
      pvVar23 = local_430;
      sVar12 = bin_text_read_write_fixed_validated(model_file,(char *)0x0,0,"",read,&msg,text);
      bVar7 = version_struct::operator>=(local_400,"7.10.2");
      lVar25 = sVar12 + lVar25;
      if (bVar7) {
        triple = SUB84((ulong)((long)(pvVar23->interactions).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar23->interactions).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5,0);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1e8);
        std::operator<<(poVar10," interactions: ");
        sVar12 = bin_text_read_write_fixed_validated(model_file,triple,4,"",read,&msg,text);
        pvVar11 = &pvVar23->interactions;
        lVar25 = sVar12 + lVar25;
        lVar22 = 0;
        for (pvVar26 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x0; pvVar26 < (undefined1 *)(ulong)(uint)triple;
            pvVar26 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&(pvVar26->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1)) {
          ngram_len = 0;
          if (!read) {
            ngram_len = *(uint32_t *)
                         ((long)&((pvVar11->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                         lVar22);
            poVar10 = std::operator<<(&local_1e8,"len: ");
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            std::operator<<(poVar10," ");
          }
          sVar12 = bin_text_read_write_fixed_validated
                             (model_file,(char *)&ngram_len,4,"",read,&msg,text);
          if (!read) {
            memcpy(buff2,*(void **)((long)&(((pvVar11->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           _M_dataplus)._M_p + lVar22),(ulong)ngram_len);
            std::operator<<(&local_1e8,"interaction: ");
            std::ostream::write((char *)&local_1e8,
                                *(long *)((long)&(((pvVar11->
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar22));
          }
          sVar13 = bin_text_read_write_fixed_validated
                             (model_file,buff2,(ulong)ngram_len,"",read,&msg,text);
          if (read) {
            _temp = (pointer)&local_378;
            local_3f8 = pvVar26;
            std::__cxx11::string::_M_construct<char_const*>((string *)&temp,buff2,buff2 + ngram_len)
            ;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pvVar11,(value_type *)&temp);
            std::__cxx11::string::~string((string *)&temp);
            pvVar26 = local_3f8;
          }
          lVar25 = sVar12 + lVar25 + sVar13;
          lVar22 = lVar22 + 0x20;
        }
        std::operator<<(&local_1e8,"\n");
        pvVar23 = local_430;
        sVar12 = bin_text_read_write_fixed_validated(model_file,(char *)0x0,0,"",read,&msg,text);
        lVar25 = sVar12 + lVar25;
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &pvVar23->interactions,
                   (pvVar23->interactions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (pvVar23->pairs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (pvVar23->pairs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &pvVar23->interactions,
                   (pvVar23->interactions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (pvVar23->triples).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (pvVar23->triples).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    bVar7 = version_struct::operator<=(local_400,"7.8.0");
    if (bVar7) {
      triple[0] = '\0';
      triple[1] = '\0';
      triple[2] = '\0';
      triple[3] = '\0';
      poVar10 = std::operator<<(&local_1e8,"rank:");
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::operator<<(poVar10,"\n");
      sVar12 = bin_text_read_write_fixed_validated(model_file,triple,4,"",read,&msg,text);
      if (triple != (char  [4])0x0) {
        std::__cxx11::string::string((string *)&temp,"rank",(allocator *)&pair_len);
        iVar8 = (*local_3c8->_vptr_options_i[1])(local_3c8,&temp);
        std::__cxx11::string::~string((string *)&temp);
        pvVar23 = local_430;
        if ((char)iVar8 == '\0') {
          std::__cxx11::string::append((char *)local_428);
          pvVar23 = local_430;
          std::__cxx11::stringstream::stringstream((stringstream *)&temp);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_378);
          std::__cxx11::stringbuf::str();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &pair_len," ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &triple_len);
          std::__cxx11::string::append((string *)local_428);
          std::__cxx11::string::~string((string *)&pair_len);
          std::__cxx11::string::~string((string *)&triple_len);
          std::__cxx11::stringstream::~stringstream((stringstream *)&temp);
        }
        else {
          poVar10 = std::operator<<(&(local_430->trace_message).super_ostream,
                                    "WARNING: this model file contains \'rank: ");
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          poVar10 = std::operator<<(poVar10,
                                    "\' value but it will be ignored as another value specified via the command line."
                                   );
          std::endl<char,std::char_traits<char>>(poVar10);
        }
      }
      lVar25 = lVar25 + sVar12;
    }
    poVar10 = std::operator<<(&local_1e8,"lda:");
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::operator<<(poVar10,"\n");
    sVar12 = bin_text_read_write_fixed_validated
                       (model_file,(char *)&pvVar23->lda,4,"",read,&msg,text);
    ngram_len = (uint32_t)
                ((ulong)((long)(pvVar23->ngram_strings).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar23->ngram_strings).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1e8);
    std::operator<<(poVar10," ngram:");
    sVar13 = bin_text_read_write_fixed_validated(model_file,(char *)&ngram_len,4,"",read,&msg,text);
    pvVar11 = &pvVar23->ngram_strings;
    lVar25 = sVar12 + lVar25 + sVar13;
    lVar22 = 0;
    for (uVar20 = 0; uVar20 < ngram_len; uVar20 = uVar20 + 1) {
      triple_len = 0;
      if (!read) {
        poVar10 = std::operator<<(&local_1e8,
                                  (string *)
                                  ((long)&(((pvVar11->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                          )._M_p + lVar22));
        std::operator<<(poVar10," ");
        pbVar1 = (pvVar11->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar19 = *(ulong *)((long)&pbVar1->_M_string_length + lVar22);
        if (2 < uVar19) {
          uVar19 = 3;
        }
        memcpy(&triple_len,*(void **)((long)&(pbVar1->_M_dataplus)._M_p + lVar22),uVar19);
      }
      sVar12 = bin_text_read_write_fixed_validated
                         (model_file,(char *)&triple_len,3,"",read,&msg,text);
      if (read) {
        std::__cxx11::string::string((string *)&temp,(char *)&triple_len,(allocator *)&pair_len);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar11,(value_type *)&temp);
        std::__cxx11::string::append((char *)local_428);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pair_len," ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp);
        std::__cxx11::string::append((string *)local_428);
        std::__cxx11::string::~string((string *)&pair_len);
        std::__cxx11::string::~string((string *)&temp);
      }
      lVar25 = lVar25 + sVar12;
      lVar22 = lVar22 + 0x20;
    }
    std::operator<<(&local_1e8,"\n");
    pvVar23 = local_430;
    sVar12 = bin_text_read_write_fixed_validated(model_file,(char *)0x0,0,"",read,&msg,text);
    skip_len = (uint32_t)
               ((ulong)((long)(pvVar23->skip_strings).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar23->skip_strings).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1e8);
    std::operator<<(poVar10," skip:");
    sVar13 = bin_text_read_write_fixed_validated(model_file,(char *)&skip_len,4,"",read,&msg,text);
    pvVar11 = &pvVar23->skip_strings;
    lVar25 = sVar12 + lVar25 + sVar13;
    lVar22 = 0;
    for (uVar20 = 0; uVar20 < skip_len; uVar20 = uVar20 + 1) {
      triple_len = 0;
      if (!read) {
        poVar10 = std::operator<<(&local_1e8,
                                  (string *)
                                  ((long)&(((pvVar11->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                          )._M_p + lVar22));
        std::operator<<(poVar10," ");
        pbVar1 = (pvVar11->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar19 = *(ulong *)((long)&pbVar1->_M_string_length + lVar22);
        if (2 < uVar19) {
          uVar19 = 3;
        }
        memcpy(&triple_len,*(void **)((long)&(pbVar1->_M_dataplus)._M_p + lVar22),uVar19);
      }
      sVar12 = bin_text_read_write_fixed_validated
                         (model_file,(char *)&triple_len,3,"",read,&msg,text);
      if (read) {
        std::__cxx11::string::string((string *)&temp,(char *)&triple_len,(allocator *)&pair_len);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar11,(value_type *)&temp);
        std::__cxx11::string::append((char *)local_428);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pair_len," ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp);
        std::__cxx11::string::append((string *)local_428);
        std::__cxx11::string::~string((string *)&pair_len);
        std::__cxx11::string::~string((string *)&temp);
      }
      lVar25 = lVar25 + sVar12;
      lVar22 = lVar22 + 0x20;
    }
    std::operator<<(&local_1e8,"\n");
    pvVar23 = local_430;
    sVar12 = bin_text_read_write_fixed_validated(model_file,(char *)0x0,0,"",read,&msg,text);
    if (read) {
      sVar14 = io_buf::bin_read_fixed(model_file,(char *)&triple_len,4,"");
      if ((sVar14 < 4) || (0x6400000 < triple_len)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&temp);
        std::operator<<(&local_378,"bad model format!");
        pvVar18 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar18,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_regressor.cc"
                   ,0x1ce,&local_50);
        __cxa_throw(pvVar18,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      resize_buf_if_needed(&buff2,&buf2_size,(ulong)triple_len);
      sVar13 = io_buf::bin_read_fixed(model_file,buff2,(ulong)triple_len,"");
      if (triple_len != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pair_len,local_428," ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pair_len,buff2);
        std::__cxx11::string::operator=((string *)local_428,(string *)&temp);
        std::__cxx11::string::~string((string *)&temp);
        std::__cxx11::string::~string((string *)&pair_len);
      }
      sVar13 = sVar13 + sVar14;
    }
    else {
      VW::config::options_serializer_boost_po::options_serializer_boost_po
                ((options_serializer_boost_po *)&temp);
      (*local_3c8->_vptr_options_i[3])(&pair_len);
      psVar6 = local_418;
      for (psVar24 = (pointer)CONCAT44(uStack_41c,pair_len); psVar24 != psVar6;
          psVar24 = psVar24 + 1) {
        peVar3 = (psVar24->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if ((peVar3->m_keep == true) &&
           (iVar8 = (*local_3c8->_vptr_options_i[1])(local_3c8,&peVar3->m_name), (char)iVar8 != '\0'
           )) {
          VW::config::options_serializer_boost_po::add
                    ((options_serializer_boost_po *)&temp,
                     (psVar24->
                     super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    );
        }
      }
      std::
      vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
      ::~vector((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
                 *)&pair_len);
      VW::config::options_serializer_boost_po::str_abi_cxx11_
                ((string *)&pair_len,(options_serializer_boost_po *)&temp);
      if ((pvVar23->save_resume == true) && (pvVar23->random_state != 0)) {
        std::__cxx11::string::append((char *)&pair_len);
        std::__cxx11::to_string((string *)triple,pvVar23->random_state);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &triple_len," ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)triple);
        std::__cxx11::string::append((string *)&pair_len);
        std::__cxx11::string::~string((string *)&triple_len);
        std::__cxx11::string::~string((string *)triple);
      }
      poVar10 = std::operator<<(&local_1e8,"options:");
      poVar10 = std::operator<<(poVar10,(string *)&pair_len);
      std::operator<<(poVar10,"\n");
      if (((ulong)local_418 & 0xffffffff) != 0) {
        local_390 = (size_t)((int)local_418 + 1);
        safe_memcpy(&buff2,&buf2_size,(void *)CONCAT44(uStack_41c,pair_len),local_390);
      }
      buff2[(ulong)local_418 & 0xffffffff] = '\0';
      sVar13 = bin_text_write(model_file,buff2,local_390,&msg,text);
      std::__cxx11::string::~string((string *)&pair_len);
      VW::config::options_serializer_boost_po::~options_serializer_boost_po
                ((options_serializer_boost_po *)&temp);
    }
    bVar7 = version_struct::operator>=(local_400,"8.0.1");
    if (bVar7) {
      bVar7 = version_struct::operator>=(local_400,"8.0.2");
      if (bVar7) {
        uVar9 = io_buf::hash(model_file);
      }
      else {
        uVar17 = uniform_hash((model_file->space)._begin,sVar12 + lVar25 + sVar13,0);
        uVar9 = (uint32_t)uVar17;
      }
      pair_len = uVar9;
      poVar10 = std::operator<<(&local_1e8,"Checksum: ");
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::operator<<(poVar10,"\n");
      bin_text_read_write(model_file,(char *)&pair_len,4,"",read,&msg,text);
      if (uVar9 != pair_len) {
        std::__cxx11::stringstream::stringstream((stringstream *)&temp);
        std::operator<<(&local_378,"Checksum is inconsistent, file is possibly corrupted.");
        pvVar18 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar18,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_regressor.cc"
                   ,0x20b,&local_70);
        __cxa_throw(pvVar18,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
    bVar7 = version_struct::operator>=(local_400,"8.0.2");
    if (bVar7) {
      model_file->_verify_hash = false;
      model_file->_hash = 0;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  }
  free(buff2);
  return;
}

Assistant:

void save_load_header(
    vw& all, io_buf& model_file, bool read, bool text, std::string& file_options, VW::config::options_i& options)
{
  char* buff2 = (char*)malloc(default_buf_size);
  size_t buf2_size = default_buf_size;

  try
  {
    if (model_file.files.size() > 0)
    {
      size_t bytes_read_write = 0;

      uint32_t v_length = (uint32_t)version.to_string().length() + 1;
      stringstream msg;
      msg << "Version " << version.to_string() << "\n";
      memcpy(buff2, version.to_string().c_str(), min(v_length, buf2_size));
      if (read)
      {
        v_length = (uint32_t)buf2_size;
        buff2[min(v_length, default_buf_size) - 1] = '\0';
      }
      bytes_read_write += bin_text_read_write(model_file, buff2, v_length, "", read, msg, text);
      all.model_file_ver = buff2;  // stored in all to check save_resume fix in gd
      VW::validate_version(all);

      if (all.model_file_ver >= VERSION_FILE_WITH_HEADER_CHAINED_HASH)
        model_file.verify_hash(true);

      if (all.model_file_ver >= VERSION_FILE_WITH_HEADER_ID)
      {
        v_length = (uint32_t)all.id.length() + 1;

        msg << "Id " << all.id << "\n";
        memcpy(buff2, all.id.c_str(), min(v_length, default_buf_size));
        if (read)
          v_length = default_buf_size;
        bytes_read_write += bin_text_read_write(model_file, buff2, v_length, "", read, msg, text);
        all.id = buff2;

        if (read && !options.was_supplied("id") && !all.id.empty())
        {
          file_options += " --id";
          file_options += " " + all.id;
        }
      }

      char model = 'm';

      bytes_read_write +=
          bin_text_read_write_fixed_validated(model_file, &model, 1, "file is not a model file", read, msg, text);

      msg << "Min label:" << all.sd->min_label << "\n";
      bytes_read_write += bin_text_read_write_fixed_validated(
          model_file, (char*)&all.sd->min_label, sizeof(all.sd->min_label), "", read, msg, text);

      msg << "Max label:" << all.sd->max_label << "\n";
      bytes_read_write += bin_text_read_write_fixed_validated(
          model_file, (char*)&all.sd->max_label, sizeof(all.sd->max_label), "", read, msg, text);

      msg << "bits:" << all.num_bits << "\n";
      uint32_t local_num_bits = all.num_bits;
      bytes_read_write += bin_text_read_write_fixed_validated(
          model_file, (char*)&local_num_bits, sizeof(local_num_bits), "", read, msg, text);

      if (read && !options.was_supplied("bit_precision"))
      {
        file_options += " --bit_precision";
        std::stringstream temp;
        temp << local_num_bits;
        file_options += " " + temp.str();
      }

      VW::validate_default_bits(all, local_num_bits);

      all.default_bits = false;
      all.num_bits = local_num_bits;

      VW::validate_num_bits(all);

      if (all.model_file_ver < VERSION_FILE_WITH_INTERACTIONS_IN_FO)
      {
        // -q, --cubic and --interactions are not saved in vw::file_options
        uint32_t pair_len = (uint32_t)all.pairs.size();

        msg << pair_len << " pairs: ";
        bytes_read_write +=
            bin_text_read_write_fixed_validated(model_file, (char*)&pair_len, sizeof(pair_len), "", read, msg, text);

        // TODO: validate pairs?
        for (size_t i = 0; i < pair_len; i++)
        {
          char pair[3] = {0, 0, 0};

          if (!read)
          {
            memcpy(pair, all.pairs[i].c_str(), 2);
            msg << all.pairs[i] << " ";
          }

          bytes_read_write += bin_text_read_write_fixed_validated(model_file, pair, 2, "", read, msg, text);
          if (read)
          {
            string temp(pair);
            if (count(all.pairs.begin(), all.pairs.end(), temp) == 0)
              all.pairs.push_back(temp);
          }
        }

        msg << "\n";
        bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);

        uint32_t triple_len = (uint32_t)all.triples.size();

        msg << triple_len << " triples: ";
        bytes_read_write += bin_text_read_write_fixed_validated(
            model_file, (char*)&triple_len, sizeof(triple_len), "", read, msg, text);

        // TODO: validate triples?
        for (size_t i = 0; i < triple_len; i++)
        {
          char triple[4] = {0, 0, 0, 0};

          if (!read)
          {
            msg << all.triples[i] << " ";
            memcpy(triple, all.triples[i].c_str(), 3);
          }
          bytes_read_write += bin_text_read_write_fixed_validated(model_file, triple, 3, "", read, msg, text);
          if (read)
          {
            string temp(triple);
            if (count(all.triples.begin(), all.triples.end(), temp) == 0)
              all.triples.push_back(temp);
          }
        }

        msg << "\n";
        bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);

        if (all.model_file_ver >=
            VERSION_FILE_WITH_INTERACTIONS)  // && < VERSION_FILE_WITH_INTERACTIONS_IN_FO (previous if)
        {
          // the only version that saves interacions among pairs and triples
          uint32_t len = (uint32_t)all.interactions.size();

          msg << len << " interactions: ";
          bytes_read_write +=
              bin_text_read_write_fixed_validated(model_file, (char*)&len, sizeof(len), "", read, msg, text);

          for (size_t i = 0; i < len; i++)
          {
            uint32_t inter_len = 0;
            if (!read)
            {
              inter_len = (uint32_t)all.interactions[i].size();
              msg << "len: " << inter_len << " ";
            }
            bytes_read_write += bin_text_read_write_fixed_validated(
                model_file, (char*)&inter_len, sizeof(inter_len), "", read, msg, text);
            if (!read)
            {
              memcpy(buff2, all.interactions[i].c_str(), inter_len);

              msg << "interaction: ";
              msg.write(all.interactions[i].c_str(), inter_len);
            }

            bytes_read_write += bin_text_read_write_fixed_validated(model_file, buff2, inter_len, "", read, msg, text);

            if (read)
            {
              string temp(buff2, inter_len);
              all.interactions.push_back(temp);
            }
          }

          msg << "\n";
          bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);
        }
        else  // < VERSION_FILE_WITH_INTERACTIONS
        {
          // pairs and triples may be restored but not reflected in interactions
          all.interactions.insert(std::end(all.interactions), std::begin(all.pairs), std::end(all.pairs));
          all.interactions.insert(std::end(all.interactions), std::begin(all.triples), std::end(all.triples));
        }
      }

      if (all.model_file_ver <= VERSION_FILE_WITH_RANK_IN_HEADER)
      {
        // to fix compatibility that was broken in 7.9
        uint32_t rank = 0;
        msg << "rank:" << rank << "\n";
        bytes_read_write +=
            bin_text_read_write_fixed_validated(model_file, (char*)&rank, sizeof(rank), "", read, msg, text);
        if (rank != 0)
        {
          if (!options.was_supplied("rank"))
          {
            file_options += " --rank";
            std::stringstream temp;
            temp << rank;
            file_options += " " + temp.str();
          }
          else
            all.trace_message << "WARNING: this model file contains 'rank: " << rank
                              << "' value but it will be ignored as another value specified via the command line."
                              << endl;
        }
      }

      msg << "lda:" << all.lda << "\n";
      bytes_read_write +=
          bin_text_read_write_fixed_validated(model_file, (char*)&all.lda, sizeof(all.lda), "", read, msg, text);

      // TODO: validate ngram_len?
      uint32_t ngram_len = (uint32_t)all.ngram_strings.size();
      msg << ngram_len << " ngram:";
      bytes_read_write +=
          bin_text_read_write_fixed_validated(model_file, (char*)&ngram_len, sizeof(ngram_len), "", read, msg, text);
      for (size_t i = 0; i < ngram_len; i++)
      {
        // have '\0' at the end for sure
        char ngram[4] = {0, 0, 0, 0};
        if (!read)
        {
          msg << all.ngram_strings[i] << " ";
          memcpy(ngram, all.ngram_strings[i].c_str(), min(3, all.ngram_strings[i].size()));
        }
        bytes_read_write += bin_text_read_write_fixed_validated(model_file, ngram, 3, "", read, msg, text);
        if (read)
        {
          std::string temp(ngram);
          all.ngram_strings.push_back(temp);

          file_options += " --ngram";
          file_options += " " + temp;
        }
      }

      msg << "\n";
      bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);

      // TODO: validate skips?
      uint32_t skip_len = (uint32_t)all.skip_strings.size();
      msg << skip_len << " skip:";
      bytes_read_write +=
          bin_text_read_write_fixed_validated(model_file, (char*)&skip_len, sizeof(skip_len), "", read, msg, text);

      for (size_t i = 0; i < skip_len; i++)
      {
        char skip[4] = {0, 0, 0, 0};
        if (!read)
        {
          msg << all.skip_strings[i] << " ";
          memcpy(skip, all.skip_strings[i].c_str(), min(3, all.skip_strings[i].size()));
        }

        bytes_read_write += bin_text_read_write_fixed_validated(model_file, skip, 3, "", read, msg, text);
        if (read)
        {
          std::string temp(skip);
          all.skip_strings.push_back(temp);

          file_options += " --skips";
          file_options += " " + temp;
        }
      }
      msg << "\n";
      bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);

      if (read)
      {
        uint32_t len;
        size_t ret = model_file.bin_read_fixed((char*)&len, sizeof(len), "");
        if (len > 104857600 /*sanity check: 100 Mb*/ || ret < sizeof(uint32_t))
          THROW("bad model format!");
        resize_buf_if_needed(buff2, buf2_size, len);
        bytes_read_write += model_file.bin_read_fixed(buff2, len, "") + ret;

        // Write out file options to caller.
        if (len > 0)
        {
          // There is a potential bug here if len is read out to be zero (e.g. corrupted file). If we naively
          // append buff2 into file_options it might contain old information and thus be invalid. Before, what
          // probably happened is boost::program_options did the right thing, but now we have to construct the
          // input to it where we do not know whether a particular option key can have multiple values or not.
          //
          // In some cases we end up with a string like: "--bit_precision 18 <something_not_an_int>", which will
          // cause a "bad program options value" exception, rather than the true "file is corrupted" issue. Only
          // pushing the contents of buff2 into file_options when it is valid will prevent this false error.
          file_options = file_options + " " + buff2;
        }
      }
      else
      {
        VW::config::options_serializer_boost_po serializer;
        for (auto const& option : options.get_all_options())
        {
          if (option->m_keep && options.was_supplied(option->m_name))
          {
            serializer.add(*option);
          }
        }

        auto serialized_keep_options = serializer.str();

        // We need to save our current PRG state
        if (all.save_resume && all.random_state != 0)
        {
          serialized_keep_options += " --random_seed";
          serialized_keep_options += " " + std::to_string(all.random_state);
        }

        msg << "options:" << serialized_keep_options << "\n";

        uint32_t len = (uint32_t)serialized_keep_options.length();
        if (len > 0)
          safe_memcpy(buff2, buf2_size, serialized_keep_options.c_str(), len + 1);
        *(buff2 + len) = 0;
        bytes_read_write += bin_text_read_write(model_file, buff2, len + 1,  // len+1 to write a \0
            "", read, msg, text);
      }

      // Read/write checksum if required by version
      if (all.model_file_ver >= VERSION_FILE_WITH_HEADER_HASH)
      {
        uint32_t check_sum = (all.model_file_ver >= VERSION_FILE_WITH_HEADER_CHAINED_HASH)
            ? model_file.hash()
            : (uint32_t)uniform_hash(model_file.space.begin(), bytes_read_write, 0);

        uint32_t check_sum_saved = check_sum;

        msg << "Checksum: " << check_sum << "\n";
        bin_text_read_write(model_file, (char*)&check_sum, sizeof(check_sum), "", read, msg, text);

        if (check_sum_saved != check_sum)
          THROW("Checksum is inconsistent, file is possibly corrupted.");
      }

      if (all.model_file_ver >= VERSION_FILE_WITH_HEADER_CHAINED_HASH)
      {
        model_file.verify_hash(false);
      }
    }
  }
  catch (...)
  {
    free(buff2);
    throw;
  }

  free(buff2);
}